

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

void mod2sparse_mulvec(mod2sparse *m,char *u,char *v)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  mod2entry *pmVar4;
  
  uVar1 = m->n_cols;
  uVar3 = 0;
  uVar2 = (ulong)(uint)m->n_rows;
  if (m->n_rows < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    v[uVar3] = '\0';
  }
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    if (u[uVar3] != '\0') {
      pmVar4 = m->cols + uVar3;
      while( true ) {
        pmVar4 = pmVar4->down;
        if ((long)pmVar4->row < 0) break;
        v[pmVar4->row] = v[pmVar4->row] ^ 1;
      }
    }
  }
  return;
}

Assistant:

void mod2sparse_mulvec
( mod2sparse *m,	/* The sparse matrix, with M rows and N columns */
  char *u,		/* The input vector, N long */
  char *v		/* Place to store the result, M long */
)
{
  mod2entry *e;
  int M, N;
  int i, j;

  M = mod2sparse_rows(m);
  N = mod2sparse_cols(m);

  for (i = 0; i<M; i++) v[i] = 0;

  for (j = 0; j<N; j++)
  { if (u[j])
    { for (e = mod2sparse_first_in_col(m,j);
           !mod2sparse_at_end(e);
           e = mod2sparse_next_in_col(e))
      { v[mod2sparse_row(e)] ^= 1;
      }
    }
  }
}